

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::EmitFunctionBody(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  Symbol *sym_00;
  code *pcVar1;
  Symbol **this_00;
  bool bVar2;
  RegSlot RVar3;
  uint sourceContextId;
  LocalFunctionId functionId;
  ParseNodeBin *pPVar4;
  CapturedSymMap *this_01;
  undefined4 *puVar5;
  Type_conflict node;
  Type *ppSVar6;
  ParseNode *pPVar7;
  CharacterBuffer<char16_t> *this_02;
  IdentPtr pid;
  bool old;
  ParseNode *decl;
  Symbol **sym;
  Iterator __iter;
  SList<Symbol_*,_Memory::ArenaAllocator,_RealCount> *list;
  CapturedSymMap *map;
  ParseNode *stmt;
  ParseNode *pnode;
  ParseNode *pnodeBody;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  bool local_9;
  
  stmt = funcInfo->root->pnodeBody;
  pnode = stmt;
  pnodeBody = (ParseNode *)funcInfo;
  funcInfo_local = (FuncInfo *)this;
  do {
    if (stmt->nop != knopList) {
      bVar2 = ParseNode::CapturesSyms(stmt);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xa00,"(!pnode->CapturesSyms())","!pnode->CapturesSyms()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      EmitTopLevelStatement(this,stmt,(FuncInfo *)pnodeBody,0);
      return;
    }
    pPVar4 = ParseNode::AsParseNodeBin(stmt);
    map = (CapturedSymMap *)pPVar4->pnode1;
    bVar2 = ParseNode::CapturesSyms((ParseNode *)map);
    if (bVar2) {
      this_01 = FuncInfo::EnsureCapturedSymMap((FuncInfo *)pnodeBody);
      __iter.current =
           (NodeBase *)
           JsUtil::
           BaseDictionary<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::Item(this_01,(ParseNode **)&map);
      _sym = SListBase<Symbol_*,_Memory::ArenaAllocator,_RealCount>::GetIterator
                       ((SListBase<Symbol_*,_Memory::ArenaAllocator,_RealCount> *)__iter.current);
      while( true ) {
        this_local = (ByteCodeGenerator *)&sym;
        if (__iter.list == (SListBase<Symbol_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        this_00 = sym;
        node = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar2 = SListBase<Symbol_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<Symbol_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node);
        if (!bVar2) {
          SListNodeBase<Memory::ArenaAllocator>::Next
                    (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
        local_9 = !bVar2;
        if (!local_9) break;
        ppSVar6 = SListBase<Symbol_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)&sym);
        bVar2 = Symbol::GetIsCommittedToSlot(*ppSVar6);
        if (!bVar2) {
          RVar3 = Symbol::GetLocation(*ppSVar6);
          if (RVar3 == 0xffffffff) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x9e9,"(sym->GetLocation() != Js::Constants::NoProperty)",
                               "sym->GetLocation() != Js::Constants::NoProperty");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          Symbol::SetIsCommittedToSlot(*ppSVar6);
          pPVar7 = Symbol::GetDecl(*ppSVar6);
          if (pPVar7 == (ParseNode *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x9ec,"(decl)","decl");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          sourceContextId =
               Js::FunctionProxy::GetSourceContextId(*(FunctionProxy **)(pnodeBody + 0x1f));
          functionId = Js::FunctionProxy::GetLocalFunctionId(*(FunctionProxy **)(pnodeBody + 0x1f));
          bVar2 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01ec1678,DelayCapturePhase,sourceContextId,functionId);
          if (bVar2) {
            this_02 = Symbol::GetName(*ppSVar6);
            JsUtil::CharacterBuffer<char16_t>::GetBuffer(this_02);
            Output::Print(L"--- DelayCapture: Committed symbol \'%s\' to slot.\n");
            Output::Flush();
          }
          bVar2 = Symbol::GetNeedDeclaration(*ppSVar6);
          Symbol::SetNeedDeclaration(*ppSVar6,false);
          RVar3 = Symbol::GetLocation(*ppSVar6);
          sym_00 = *ppSVar6;
          pid = Symbol::GetPid(*ppSVar6);
          EmitPropStore(this,RVar3,sym_00,pid,(FuncInfo *)pnodeBody,pPVar7->nop == knopLetDecl,
                        pPVar7->nop == knopConstDecl,false,false);
          Symbol::SetNeedDeclaration(*ppSVar6,bVar2);
        }
      }
    }
    EmitTopLevelStatement(this,(ParseNode *)map,(FuncInfo *)pnodeBody,0);
    pPVar4 = ParseNode::AsParseNodeBin(stmt);
    stmt = pPVar4->pnode2;
  } while( true );
}

Assistant:

void ByteCodeGenerator::EmitFunctionBody(FuncInfo *funcInfo)
{
    // Emit a function body. Only explicit returns and the implicit "undef" at the bottom
    // get copied to the return register.
    ParseNode *pnodeBody = funcInfo->root->pnodeBody;
    ParseNode *pnode = pnodeBody;
    while (pnode->nop == knopList)
    {
        ParseNode *stmt = pnode->AsParseNodeBin()->pnode1;
        if (stmt->CapturesSyms())
        {
            CapturedSymMap *map = funcInfo->EnsureCapturedSymMap();
            SList<Symbol*> *list = map->Item(stmt);
            FOREACH_SLIST_ENTRY(Symbol*, sym, list)
            {
                if (!sym->GetIsCommittedToSlot())
                {
                    Assert(sym->GetLocation() != Js::Constants::NoProperty);
                    sym->SetIsCommittedToSlot();
                    ParseNode *decl = sym->GetDecl();
                    Assert(decl);
                    if (PHASE_TRACE(Js::DelayCapturePhase, funcInfo->byteCodeFunction))
                    {
                        Output::Print(_u("--- DelayCapture: Committed symbol '%s' to slot.\n"),
                            sym->GetName().GetBuffer());
                        Output::Flush();
                    }
                    // REVIEW[ianhall]: HACK to work around this causing an error due to sym not yet being initialized
                    // what is this doing? Why are we assigning sym to itself?
                    bool old = sym->GetNeedDeclaration();
                    sym->SetNeedDeclaration(false);
                    this->EmitPropStore(sym->GetLocation(), sym, sym->GetPid(), funcInfo, decl->nop == knopLetDecl, decl->nop == knopConstDecl);
                    sym->SetNeedDeclaration(old);
                }
            }
            NEXT_SLIST_ENTRY;
        }
        EmitTopLevelStatement(stmt, funcInfo, false);
        pnode = pnode->AsParseNodeBin()->pnode2;
    }
    Assert(!pnode->CapturesSyms());
    EmitTopLevelStatement(pnode, funcInfo, false);
}